

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O3

void __thiscall
common_arg::common_arg
          (common_arg *this,initializer_list<const_char_*> *args,string *help,
          _func_void_common_params_ptr *handler)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  initializer_list<llama_example> __l;
  allocator_type local_2f;
  allocator_type local_2e;
  less<llama_example> local_2d;
  llama_example local_2c;
  
  local_2c = LLAMA_EXAMPLE_COMMON;
  __l._M_len = 1;
  __l._M_array = &local_2c;
  std::set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>::set
            (&this->examples,__l,&local_2d,&local_2e);
  p_Var1 = &(this->excludes)._M_t._M_impl.super__Rb_tree_header;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->excludes)._M_t._M_impl = 0;
  *(undefined8 *)&(this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->args,*args,&local_2f);
  this->value_hint = (char *)0x0;
  this->value_hint_2 = (char *)0x0;
  this->env = (char *)0x0;
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  pcVar2 = (help->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->help,pcVar2,pcVar2 + help->_M_string_length);
  this->is_sparam = false;
  this->handler_void = handler;
  this->handler_string = (_func_void_common_params_ptr_string_ptr *)0x0;
  this->handler_str_str = (_func_void_common_params_ptr_string_ptr_string_ptr *)0x0;
  this->handler_int = (_func_void_common_params_ptr_int *)0x0;
  return;
}

Assistant:

common_arg(
        const std::initializer_list<const char *> & args,
        const std::string & help,
        void (*handler)(common_params & params)
    ) : args(args), help(help), handler_void(handler) {}